

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O1

bool crnlib::string_to_int(char **pBuf,int *value)

{
  bool bVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  
  *value = 0;
  pcVar7 = *pBuf;
  cVar3 = *pcVar7;
  while ((cVar3 != '\0' && (iVar2 = isspace((int)cVar3), iVar2 != 0))) {
    cVar3 = pcVar7[1];
    pcVar7 = pcVar7 + 1;
  }
  if ((int)cVar3 - 0x3aU < 0xfffffff6) {
    if (cVar3 != '-') {
      return false;
    }
    pcVar7 = pcVar7 + 1;
  }
  uVar5 = 0;
  while ((*pcVar7 != '\0' && (uVar4 = (int)*pcVar7 - 0x30, uVar4 < 10))) {
    if (0x1fffffff < uVar5) {
      return false;
    }
    if (CARRY4(uVar5 * 8,uVar5 * 2)) {
      bVar1 = false;
    }
    else {
      uVar6 = ~(uVar5 * 10);
      bVar1 = uVar4 <= uVar6;
      if (uVar6 < uVar4) {
        uVar4 = 0;
      }
      uVar5 = uVar4 + uVar5 * 10;
      pcVar7 = pcVar7 + bVar1;
    }
    if (!bVar1) {
      return false;
    }
  }
  if ((int)cVar3 - 0x3aU < 0xfffffff6) {
    if (uVar5 < 0x80000001) {
      uVar5 = -uVar5;
LAB_001468a4:
      *value = uVar5;
      *pBuf = pcVar7;
      return true;
    }
  }
  else if (-1 < (int)uVar5) goto LAB_001468a4;
  *value = 0;
  return false;
}

Assistant:

bool string_to_int(const char*& pBuf, int& value)
    {
        value = 0;

        CRNLIB_ASSERT(pBuf);
        const char* p = pBuf;

        while (*p && isspace(*p))
        {
            p++;
        }

        uint result = 0;
        bool negative = false;

        if (!isdigit(*p))
        {
            if (p[0] == '-')
            {
                negative = true;
                p++;
            }
            else
            {
                return false;
            }
        }

        while (*p && isdigit(*p))
        {
            if (result & 0xE0000000U)
            {
                return false;
            }

            const uint result8 = result << 3U;
            const uint result2 = result << 1U;

            if (result2 > (0xFFFFFFFFU - result8))
            {
                return false;
            }

            result = result8 + result2;

            uint c = p[0] - '0';
            if (c > (0xFFFFFFFFU - result))
            {
                return false;
            }

            result += c;

            p++;
        }

        if (negative)
        {
            if (result > 0x80000000U)
            {
                value = 0;
                return false;
            }
            value = -static_cast<int>(result);
        }
        else
        {
            if (result > 0x7FFFFFFFU)
            {
                value = 0;
                return false;
            }
            value = static_cast<int>(result);
        }

        pBuf = p;

        return true;
    }